

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O1

string_view __thiscall inja::Lexer::clear_final_line_if_whitespace(Lexer *this,string_view text)

{
  byte bVar1;
  Lexer *pLVar2;
  int iVar3;
  string_view sVar4;
  
  pLVar2 = this;
  do {
    if (pLVar2 == (Lexer *)0x0) goto LAB_001636b2;
    bVar1 = ((char *)text._M_len + -1)[(long)pLVar2];
    iVar3 = 3;
    if (bVar1 < 0xd) {
      if (bVar1 == 9) {
LAB_0016369d:
        pLVar2 = (Lexer *)((long)&pLVar2[-1].pos + 7);
        iVar3 = 0;
      }
      else if (bVar1 != 10) {
LAB_001636a4:
        iVar3 = 1;
      }
    }
    else if (bVar1 != 0xd) {
      if (bVar1 != 0x20) goto LAB_001636a4;
      goto LAB_0016369d;
    }
  } while (iVar3 == 0);
  if (iVar3 == 3) {
LAB_001636b2:
    this = pLVar2;
  }
  sVar4._M_str = (char *)text._M_len;
  sVar4._M_len = (size_t)this;
  return sVar4;
}

Assistant:

static std::string_view clear_final_line_if_whitespace(std::string_view text) {
    std::string_view result = text;
    while (!result.empty()) {
      const char ch = result.back();
      if (ch == ' ' || ch == '\t') {
        result.remove_suffix(1);
      } else if (ch == '\n' || ch == '\r') {
        break;
      } else {
        return text;
      }
    }
    return result;
  }